

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTCTEgl_TessLevel::deinitTestDescriptor
          (TessellationShaderTCTEgl_TessLevel *this,_test_descriptor *test_ptr)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  _test_descriptor *test_ptr_local;
  TessellationShaderTCTEgl_TessLevel *this_local;
  long lVar3;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (test_ptr->fs_id != 0) {
    (**(code **)(lVar3 + 0x470))(test_ptr->fs_id);
    test_ptr->fs_id = 0;
  }
  if (test_ptr->po_id != 0) {
    (**(code **)(lVar3 + 0x448))(test_ptr->po_id);
    test_ptr->po_id = 0;
  }
  if (test_ptr->tcs_id != 0) {
    (**(code **)(lVar3 + 0x470))(test_ptr->tcs_id);
    test_ptr->tcs_id = 0;
  }
  if (test_ptr->tes_id != 0) {
    (**(code **)(lVar3 + 0x470))(test_ptr->tes_id);
    test_ptr->tes_id = 0;
  }
  if (test_ptr->vs_id != 0) {
    (**(code **)(lVar3 + 0x470))(test_ptr->vs_id);
    test_ptr->vs_id = 0;
  }
  return;
}

Assistant:

void TessellationShaderTCTEgl_TessLevel::deinitTestDescriptor(_test_descriptor* test_ptr)
{
	/* Call base class' deinit() */
	TestCaseBase::deinit();

	/* Release all objects */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (test_ptr->fs_id != 0)
	{
		gl.deleteShader(test_ptr->fs_id);

		test_ptr->fs_id = 0;
	}

	if (test_ptr->po_id != 0)
	{
		gl.deleteProgram(test_ptr->po_id);

		test_ptr->po_id = 0;
	}

	if (test_ptr->tcs_id != 0)
	{
		gl.deleteShader(test_ptr->tcs_id);

		test_ptr->tcs_id = 0;
	}

	if (test_ptr->tes_id != 0)
	{
		gl.deleteShader(test_ptr->tes_id);

		test_ptr->tes_id = 0;
	}

	if (test_ptr->vs_id != 0)
	{
		gl.deleteShader(test_ptr->vs_id);

		test_ptr->vs_id = 0;
	}
}